

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_audio_buffer_ref_read_pcm_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,void *pFramesOut,ma_uint64 frameCount,
                    ma_bool32 loop)

{
  ma_uint64 mVar1;
  ma_uint64 mVar2;
  ulong uVar3;
  ulong uVar4;
  void *__src;
  void *__dest;
  ma_uint64 mVar5;
  
  if (frameCount == 0 || pAudioBufferRef == (ma_audio_buffer_ref *)0x0) {
    mVar5 = 0;
  }
  else {
    mVar5 = 0;
    while (uVar3 = frameCount - mVar5, mVar5 <= frameCount && uVar3 != 0) {
      mVar1 = pAudioBufferRef->cursor;
      mVar2 = pAudioBufferRef->sizeInFrames;
      uVar4 = mVar2 - mVar1;
      if (uVar3 < mVar2 - mVar1) {
        uVar4 = uVar3;
      }
      if (pFramesOut != (void *)0x0) {
        uVar3 = (ulong)(*(int *)(&DAT_001908a0 + (ulong)pAudioBufferRef->format * 4) *
                       pAudioBufferRef->channels);
        __dest = (void *)(mVar5 * uVar3 + (long)pFramesOut);
        __src = (void *)(mVar1 * uVar3 + (long)pAudioBufferRef->pData);
        if (__dest != __src) {
          memcpy(__dest,__src,uVar3 * uVar4);
          mVar1 = pAudioBufferRef->cursor;
          mVar2 = pAudioBufferRef->sizeInFrames;
        }
      }
      mVar5 = mVar5 + uVar4;
      pAudioBufferRef->cursor = mVar1 + uVar4;
      if (mVar1 + uVar4 == mVar2) {
        if (loop == 0) {
          return mVar5;
        }
        pAudioBufferRef->cursor = 0;
      }
    }
  }
  return mVar5;
}

Assistant:

MA_API ma_uint64 ma_audio_buffer_ref_read_pcm_frames(ma_audio_buffer_ref* pAudioBufferRef, void* pFramesOut, ma_uint64 frameCount, ma_bool32 loop)
{
    ma_uint64 totalFramesRead = 0;

    if (pAudioBufferRef == NULL) {
        return 0;
    }

    if (frameCount == 0) {
        return 0;
    }

    while (totalFramesRead < frameCount) {
        ma_uint64 framesAvailable = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
        ma_uint64 framesRemaining = frameCount - totalFramesRead;
        ma_uint64 framesToRead;

        framesToRead = framesRemaining;
        if (framesToRead > framesAvailable) {
            framesToRead = framesAvailable;
        }

        if (pFramesOut != NULL) {
            ma_copy_pcm_frames(ma_offset_ptr(pFramesOut, totalFramesRead * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels)), ma_offset_ptr(pAudioBufferRef->pData, pAudioBufferRef->cursor * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels)), framesToRead, pAudioBufferRef->format, pAudioBufferRef->channels);
        }

        totalFramesRead += framesToRead;

        pAudioBufferRef->cursor += framesToRead;
        if (pAudioBufferRef->cursor == pAudioBufferRef->sizeInFrames) {
            if (loop) {
                pAudioBufferRef->cursor = 0;
            } else {
                break;  /* We've reached the end and we're not looping. Done. */
            }
        }

        MA_ASSERT(pAudioBufferRef->cursor < pAudioBufferRef->sizeInFrames);
    }

    return totalFramesRead;
}